

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetFixingDate
          (FXBase *this,string *fixing_key,Date *date)

{
  FX *pFVar1;
  string local_40;
  Date *local_20;
  Date *date_local;
  string *fixing_key_local;
  FXBase *this_local;
  
  pFVar1 = this->outer_class_;
  local_20 = date;
  date_local = (Date *)fixing_key;
  fixing_key_local = (string *)this;
  tools::Date::ToString_abi_cxx11_(&local_40,date);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,fixing_key,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetFixingDate(const std::string& fixing_key, Date* date)
{
    outer_class_.subject_builder_.SetComponent(fixing_key, date->ToString());
}